

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O0

int __thiscall Fl_Text_Display::xy_to_position(Fl_Text_Display *this,int X,int Y,int posType)

{
  int lineStartPos;
  int lineLen_00;
  int local_34;
  int visLineNum;
  int fontHeight;
  int lineLen;
  int lineStart;
  int posType_local;
  int Y_local;
  int X_local;
  Fl_Text_Display *this_local;
  
  local_34 = (Y - (this->text_area).y) / this->mMaxsize;
  if (local_34 < 0) {
    this_local._4_4_ = this->mFirstChar;
  }
  else {
    if (this->mNVisibleLines <= local_34) {
      local_34 = this->mNVisibleLines + -1;
    }
    lineStartPos = this->mLineStarts[local_34];
    if (lineStartPos == -1) {
      this_local._4_4_ = Fl_Text_Buffer::length(this->mBuffer);
    }
    else {
      lineLen_00 = vline_length(this,local_34);
      this_local._4_4_ = handle_vline(this,1,lineStartPos,lineLen_00,0,0,0,0,(this->text_area).x,X);
    }
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Text_Display::xy_to_position( int X, int Y, int posType ) const {
  int lineStart, lineLen, fontHeight;
  int visLineNum;

  /* Find the visible line number corresponding to the Y coordinate */
  fontHeight = mMaxsize;
  visLineNum = ( Y - text_area.y ) / fontHeight;
  if ( visLineNum < 0 )
    return mFirstChar;
  if ( visLineNum >= mNVisibleLines )
    visLineNum = mNVisibleLines - 1;

  /* Find the position at the start of the line */
  lineStart = mLineStarts[ visLineNum ];

  /* If the line start was empty, return the last position in the buffer */
  if ( lineStart == -1 )
    return mBuffer->length();

  /* Get the line text and its length */
  lineLen = vline_length( visLineNum );

  return handle_vline(FIND_INDEX,
                      lineStart, lineLen, 0, 0,
                      0, 0,
                      text_area.x, X);
}